

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::Print(Parser *this,ostream *out)

{
  ostream *poVar1;
  size_type sVar2;
  reference var;
  reference var_00;
  const_reference func;
  const_reference ppCVar3;
  void *this_00;
  const_reference func_00;
  int local_30;
  int local_2c;
  int r;
  int o_1;
  int s_2;
  int s_1;
  int o;
  int s;
  ostream *out_local;
  Parser *this_local;
  
  poVar1 = std::operator<<(out,"State variables");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  s_1 = 0;
  while( true ) {
    sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                      (&this->curr_state_vars_);
    if (sVar2 <= (ulong)(long)s_1) break;
    poVar1 = std::operator<<(out,"s[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,s_1);
    poVar1 = std::operator<<(poVar1,"] = ");
    var = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                    (&this->curr_state_vars_,(long)s_1);
    poVar1 = despot::operator<<(poVar1,var);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    s_1 = s_1 + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"Observation variables");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  s_2 = 0;
  while( true ) {
    sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_)
    ;
    if (sVar2 <= (ulong)(long)s_2) break;
    poVar1 = std::operator<<(out,"o[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,s_2);
    poVar1 = std::operator<<(poVar1,"] = ");
    var_00 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)s_2);
    poVar1 = despot::operator<<(poVar1,var_00);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    s_2 = s_2 + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"# Initial belief");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  o_1 = 0;
  while( true ) {
    sVar2 = std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::size
                      (&this->initial_belief_funcs_);
    if (sVar2 <= (ulong)(long)o_1) break;
    poVar1 = std::operator<<(out,"s[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,o_1);
    poVar1 = std::operator<<(poVar1,"] = ");
    func = std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::operator[]
                     (&this->initial_belief_funcs_,(long)o_1);
    poVar1 = despot::operator<<(poVar1,(Function *)func);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    o_1 = o_1 + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"# Transition probabilities");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  r = 0;
  while( true ) {
    sVar2 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::size
                      (&this->transition_funcs_);
    if (sVar2 <= (ulong)(long)r) break;
    poVar1 = std::operator<<(out,"s[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,r);
    poVar1 = std::operator<<(poVar1,"] = ");
    ppCVar3 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                        (&this->transition_funcs_,(long)r);
    poVar1 = despot::operator<<(poVar1,&(*ppCVar3)->super_Function);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    r = r + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"# Observation probabilities");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_2c = 0;
  while( true ) {
    sVar2 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::size(&this->obs_funcs_);
    if (sVar2 <= (ulong)(long)local_2c) break;
    poVar1 = std::operator<<(out,"o[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
    poVar1 = std::operator<<(poVar1,"] = ");
    ppCVar3 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                        (&this->obs_funcs_,(long)local_2c);
    this_00 = (void *)std::ostream::operator<<(poVar1,*ppCVar3);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_2c = local_2c + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"# Reward functions");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<despot::Function,_std::allocator<despot::Function>_>::size
                      (&this->reward_funcs_);
    if (sVar2 <= (ulong)(long)local_30) break;
    poVar1 = std::operator<<(out,"r[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
    poVar1 = std::operator<<(poVar1,"] = ");
    func_00 = std::vector<despot::Function,_std::allocator<despot::Function>_>::operator[]
                        (&this->reward_funcs_,(long)local_30);
    poVar1 = despot::operator<<(poVar1,func_00);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_30 = local_30 + 1;
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Parser::Print(ostream& out) const {
	out << "State variables" << endl;
	for (int s = 0; s < curr_state_vars_.size(); s++) {
		out << "s[" << s << "] = " << curr_state_vars_[s] << endl;
	}
	out << endl;

	out << "Observation variables" << endl;
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << "o[" << o << "] = " << obs_vars_[o] << endl;
	}
	out << endl;

	out << "# Initial belief" << endl;
	for (int s = 0; s < initial_belief_funcs_.size(); s++) {
		out << "s[" << s << "] = " << initial_belief_funcs_[s] << endl;
	}
	out << endl;

	out << "# Transition probabilities" << endl;
	for (int s = 0; s < transition_funcs_.size(); s++) {
		out << "s[" << s << "] = " << *transition_funcs_[s] << endl;
	}
	out << endl;

	out << "# Observation probabilities" << endl;
	for (int o = 0; o < obs_funcs_.size(); o++) {
		out << "o[" << o << "] = " << obs_funcs_[o] << endl;
	}
	out << endl;

	out << "# Reward functions" << endl;
	for (int r = 0; r < reward_funcs_.size(); r++) {
		out << "r[" << r << "] = " << reward_funcs_[r] << endl;
	}
	out << endl;
}